

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O0

void mxx::
     stable_distribute<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                begin,__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      end,
               __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               out,comm *comm)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  unsigned_long uVar4;
  unsigned_long *puVar5;
  reference pvVar6;
  size_t sVar7;
  pair<int,_int> *local_170;
  pair<int,_int> *local_168;
  RecvType *recv_buf;
  SendType *send_buf;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  size_t nsend;
  size_t left_to_send;
  undefined1 local_f8 [4];
  int first_p;
  blk_dist part;
  allocator<unsigned_long> local_a9;
  value_type_conflict2 local_a8;
  undefined1 local_a0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  size_t prefix;
  size_t total_size;
  unsigned_long local_50;
  size_t local_size;
  comm *local_40;
  pair<int,_int> *local_38;
  pair<int,_int> *local_30;
  comm *local_28;
  comm *comm_local;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  out_local;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  end_local;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  begin_local;
  
  local_28 = comm;
  comm_local = (comm *)out._M_current;
  out_local = end;
  end_local = begin;
  iVar3 = mxx::comm::size(comm);
  if (iVar3 == 1) {
    local_30 = end_local._M_current;
    local_38 = out_local._M_current;
    local_40 = comm_local;
    std::
    copy<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
              (end_local,out_local,
               (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                )comm_local);
  }
  else {
    local_50 = std::
               distance<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                         (end_local,out_local);
    uVar4 = allreduce<unsigned_long>(&local_50,local_28);
    if (uVar4 != 0) {
      bVar2 = any_of(local_50 == uVar4,local_28);
      if (bVar2) {
        impl::
        distribute_scatter<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                  (end_local,out_local,
                   (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                    )comm_local,uVar4,local_28);
      }
      else {
        send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)exscan<unsigned_long>(&local_50,local_28);
        iVar3 = mxx::comm::size(local_28);
        local_a8 = 0;
        std::allocator<unsigned_long>::allocator(&local_a9);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0,(long)iVar3,
                   &local_a8,&local_a9);
        std::allocator<unsigned_long>::~allocator(&local_a9);
        blk_dist_buf::blk_dist_buf((blk_dist_buf *)local_f8,uVar4,local_28);
        if (local_50 != 0) {
          left_to_send._4_4_ =
               blk_dist_buf::rank_of
                         ((blk_dist_buf *)local_f8,
                          (size_t)send_counts.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
          nsend = local_50;
          while( true ) {
            uVar1 = left_to_send._4_4_;
            bVar2 = false;
            if (nsend != 0) {
              iVar3 = mxx::comm::size(local_28);
              bVar2 = (int)uVar1 < iVar3;
            }
            if (!bVar2) break;
            sVar7 = blk_dist_buf::iprefix_size((blk_dist_buf *)local_f8,left_to_send._4_4_);
            recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)(sVar7 - (long)send_counts.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
            puVar5 = std::min<unsigned_long>
                               ((unsigned_long *)
                                &recv_counts.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,&nsend);
            uVar4 = *puVar5;
            pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                               ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0,
                                (long)(int)left_to_send._4_4_);
            *pvVar6 = uVar4;
            nsend = nsend - uVar4;
            send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)(uVar4 + (long)send_counts.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
            left_to_send._4_4_ = left_to_send._4_4_ + 1;
          }
        }
        all2all<unsigned_long>
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&send_buf,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0,local_28);
        if (local_50 == 0) {
          local_168 = (pair<int,_int> *)0x0;
        }
        else {
          local_168 = __gnu_cxx::
                      __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      ::operator*(&end_local);
        }
        sVar7 = blk_dist_buf::local_size((blk_dist_buf *)local_f8);
        if (sVar7 == 0) {
          local_170 = (pair<int,_int> *)0x0;
        }
        else {
          local_170 = __gnu_cxx::
                      __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      ::operator*((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                   *)&comm_local);
        }
        all2allv<std::pair<int,int>>
                  (local_168,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0,
                   local_170,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&send_buf,
                   local_28);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&send_buf);
        blk_dist_buf::~blk_dist_buf((blk_dist_buf *)local_f8);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a0);
      }
    }
  }
  return;
}

Assistant:

void stable_distribute(_InIterator begin, _InIterator end, _OutIterator out, const mxx::comm& comm) {
    // if there's only one process, return a copy
    if (comm.size() == 1) {
        std::copy(begin, end, out);
        return;
    }

    // get local and global size
    size_t local_size = std::distance(begin, end);
    size_t total_size = mxx::allreduce(local_size, comm);

    if (total_size == 0) {
        return;
    }

    // one process has all elements -> use scatter instead of all2all
    if (mxx::any_of(local_size == total_size, comm)) {
        impl::distribute_scatter(begin, end, out, total_size, comm);
    } else {
        // get prefix sum of size and total size
        size_t prefix = mxx::exscan(local_size, comm);

        // calculate where to send elements
        // if there are any elements to send
        std::vector<size_t> send_counts(comm.size(), 0);
        blk_dist part(total_size, comm);
        if (local_size > 0) {
          int first_p = part.rank_of(prefix);
          size_t left_to_send = local_size;
          for (; left_to_send > 0 && first_p < comm.size(); ++first_p) {
              size_t nsend = std::min<size_t>(part.iprefix_size(first_p) - prefix, left_to_send);
              send_counts[first_p] = nsend;
              left_to_send -= nsend;
              prefix += nsend;
          }
        }
        std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
        // TODO: accept iterators in mxx::all2all?
        using SendType = typename std::iterator_traits<_InIterator>::value_type;
        using RecvType = typename std::iterator_traits<_OutIterator>::value_type;
        const SendType* send_buf = (local_size > 0) ? &(*begin) : nullptr;
        RecvType* recv_buf = (part.local_size() > 0) ? &(*out) : nullptr;
        mxx::all2allv(send_buf, send_counts, recv_buf, recv_counts, comm);
    }
}